

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

void metacall_constructor(void)

{
  int iVar1;
  portability_atexit_fn handler;
  void **size;
  void *pvVar2;
  void **str;
  void **options_map;
  void **host_tuple;
  metacall_initialize_configuration_type config [2];
  char *metacall_host;
  size_t in_stack_ffffffffffffffc8;
  void **in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  metacall_initialize_configuration_type *initialize_config;
  
  if (metacall_initialize_flag == 1) {
    handler = (portability_atexit_fn)
              environment_variable_get(in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0);
    portability_atexit_initialize();
    if (handler != (portability_atexit_fn)0x0) {
      metacall_value_create_map(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      initialize_config = (metacall_initialize_configuration_type *)0x0;
      size = metacall_value_to_map((void *)0x1338c0);
      pvVar2 = metacall_value_create_array(in_stack_ffffffffffffffd0,(size_t)size);
      *size = pvVar2;
      str = metacall_value_to_array((void *)0x1338e8);
      pvVar2 = metacall_value_create_string((char *)str,(size_t)size);
      *str = pvVar2;
      pvVar2 = metacall_value_create_bool('\0');
      str[1] = pvVar2;
      iVar1 = metacall_initialize_ex(initialize_config);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x72,"metacall_constructor",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                          ,LOG_LEVEL_ERROR,"MetaCall host constructor failed to initialize");
        metacall_value_destroy((void *)0x133966);
        exit(1);
      }
      portability_atexit_register(handler);
    }
  }
  return;
}

Assistant:

portability_constructor(metacall_constructor)
{
	if (metacall_initialize_flag == 1)
	{
		const char *metacall_host = environment_variable_get("METACALL_HOST", NULL);

		/* Initialize at exit handlers */
		portability_atexit_initialize();

		/* We are running from a different host, initialize the loader of the host
		* and redirect it to the existing symbols, also avoiding initialization
		* and destruction of the runtime as it is being managed externally to MetaCall */
		if (metacall_host != NULL)
		{
			static const char host_str[] = "host";

			struct metacall_initialize_configuration_type config[] = {
				{ metacall_host, metacall_value_create_map(NULL, 1) },
				{ NULL, NULL }
			};

			/* Initialize the loader options with a map defining its options to { "host": true } */
			void **host_tuple, **options_map = metacall_value_to_map(config[0].options);

			options_map[0] = metacall_value_create_array(NULL, 2);

			host_tuple = metacall_value_to_array(options_map[0]);

			host_tuple[0] = metacall_value_create_string(host_str, sizeof(host_str) - 1);
			host_tuple[1] = metacall_value_create_bool(1);

			/* Initialize MetaCall with extra options, defining the host properly */
			if (metacall_initialize_ex(config) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "MetaCall host constructor failed to initialize");
				metacall_value_destroy(config[0].options);
				exit(1);
			}

			/* Register the destructor on exit */
			portability_atexit_register(metacall_destroy);
		}
	}
}